

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O2

void wallet::wallet_crypto_tests::TestCrypter::TestEncrypt
               (CCrypter *crypt,span<const_unsigned_char,_18446744073709551615UL> plaintext,
               span<const_unsigned_char,_18446744073709551615UL> correct_ciphertext)

{
  __normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
  __last;
  __extent_storage<18446744073709551615UL> _Var1;
  iterator it;
  __normal_iterator<const_unsigned_char_*,_std::span<const_unsigned_char,_18446744073709551615UL>_>
  __first;
  long in_FS_OFFSET;
  allocator_type local_51;
  CKeyingMaterial local_50;
  long local_38;
  
  _Var1 = plaintext._M_extent._M_extent_value;
  __first._M_current = plaintext._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __last._M_current = __first._M_current + _Var1._M_extent_value;
  std::vector<unsigned_char,secure_allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::span<unsigned_char_const,18446744073709551615ul>>,void>
            ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_50,__first,__last,
             &local_51);
  TestEncryptSingle(crypt,&local_50,correct_ciphertext);
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_50);
  for (; _Var1._M_extent_value != 0; _Var1._M_extent_value = _Var1._M_extent_value - 1) {
    std::vector<unsigned_char,secure_allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::span<unsigned_char_const,18446744073709551615ul>>,void>
              ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_50,__first,__last,
               &local_51);
    TestEncryptSingle(crypt,&local_50,(span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0))
    ;
    std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_50);
    __first._M_current = __first._M_current + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestEncrypt(const CCrypter& crypt, const std::span<const unsigned char> plaintext,
                        const std::span<const unsigned char> correct_ciphertext = {})
{
    TestEncryptSingle(crypt, CKeyingMaterial{plaintext.begin(), plaintext.end()}, correct_ciphertext);
    for (auto it{plaintext.begin()}; it != plaintext.end(); ++it) {
        TestEncryptSingle(crypt, CKeyingMaterial{it, plaintext.end()});
    }
}